

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLGrammarPoolImpl::cacheGrammar(XMLGrammarPoolImpl *this,Grammar *gramToCache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  void *key;
  XMLCh *grammarKey;
  Grammar *gramToCache_local;
  XMLGrammarPoolImpl *this_local;
  
  if (((this->fLocked & 1U) == 0) && (gramToCache != (Grammar *)0x0)) {
    iVar2 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[0x16])();
    key = (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))();
    bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                      (this->fGrammarRegistry,key);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::put
                (this->fGrammarRegistry,key,gramToCache);
      if ((this->fXSModelIsValid & 1U) != 0) {
        iVar2 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[5])();
        if (iVar2 == 1) {
          this->fXSModelIsValid = false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool XMLGrammarPoolImpl::cacheGrammar(Grammar* const               gramToCache )
{
    if(fLocked || !gramToCache)
        return false;

    const XMLCh* grammarKey = gramToCache->getGrammarDescription()->getGrammarKey();

    if (fGrammarRegistry->containsKey(grammarKey))
    {
        return false;
    }

    fGrammarRegistry->put((void*) grammarKey, gramToCache);

    if (fXSModelIsValid && gramToCache->getGrammarType() == Grammar::SchemaGrammarType)
    {
        fXSModelIsValid = false;
    }
    return true;
}